

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_openssl.c
# Opt level: O1

int x509_openssl_add_certificates(SSL_CTX *ssl_ctx,char *certificates)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  X509_STORE *ctx;
  BIO_METHOD *type;
  BIO *bp;
  size_t sVar3;
  X509 *x;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  
  if (ssl_ctx == (SSL_CTX *)0x0 || certificates == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x15f;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar6 = "NULL";
      if (certificates != (char *)0x0) {
        pcVar6 = certificates;
      }
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/x509_openssl.c"
                ,"x509_openssl_add_certificates",0x15e,1,
                "invalid argument SSL_CTX* ssl_ctx=%p, const char* certificates=%s",ssl_ctx,pcVar6);
    }
  }
  else {
    ctx = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
    if (ctx == (X509_STORE *)0x0) {
      log_ERR_get_error("failure in SSL_CTX_get_cert_store.");
      iVar1 = 0x168;
    }
    else {
      type = BIO_s_mem();
      if (type == (BIO_METHOD *)0x0) {
        log_ERR_get_error("failure in BIO_s_mem");
        iVar1 = 0x177;
      }
      else {
        bp = BIO_new(type);
        if (bp == (BIO *)0x0) {
          log_ERR_get_error("failure in BIO_new");
          iVar1 = 0x181;
        }
        else {
          iVar1 = BIO_puts(bp,certificates);
          if ((iVar1 < 0) || (sVar3 = strlen(certificates), iVar1 != (int)sVar3)) {
            log_ERR_get_error("failure in BIO_puts");
            iVar1 = 0x18b;
          }
          else {
            x = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            while (iVar1 = 0, x != (X509 *)0x0) {
              iVar1 = X509_STORE_add_cert(ctx,x);
              if (iVar1 == 0) {
                uVar4 = ERR_peek_error();
                uVar5 = 0x7fffffff;
                if (-1 < (int)(uint)uVar4) {
                  uVar5 = 0x7fffff;
                }
                if ((uVar5 & (uint)uVar4) != 0x65) {
                  log_ERR_get_error("failure in X509_STORE_add_cert");
                  X509_free(x);
                  iVar1 = 0x1b2;
                  break;
                }
              }
              X509_free(x);
              x = PEM_read_bio_X509(bp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
            }
          }
          BIO_free(bp);
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int x509_openssl_add_certificates(SSL_CTX* ssl_ctx, const char* certificates)
{
    int result;

    /*Codes_SRS_X509_OPENSSL_02_010: [ If ssl_ctx is NULL then x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
    /*Codes_SRS_X509_OPENSSL_02_011: [ If certificates is NULL then x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
    if ((certificates == NULL) || (ssl_ctx == NULL))
    {
        /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
        LogError("invalid argument SSL_CTX* ssl_ctx=%p, const char* certificates=%s", ssl_ctx, MU_P_OR_NULL(certificates));
        result = MU_FAILURE;
    }
    else
    {
        X509_STORE* cert_store = SSL_CTX_get_cert_store(ssl_ctx);
        if (cert_store == NULL)
        {
            /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
            log_ERR_get_error("failure in SSL_CTX_get_cert_store.");
            result = MU_FAILURE;
        }
        else
        {
            /*Codes_SRS_X509_OPENSSL_02_012: [ x509_openssl_add_certificates shall get the memory BIO method function by calling BIO_s_mem. ]*/
#if (OPENSSL_VERSION_NUMBER >= 0x10100000L) || defined(LIBRESSL_VERSION_NUMBER)
            const BIO_METHOD* bio_method;
#else
            BIO_METHOD* bio_method;
#endif
            bio_method = BIO_s_mem();
            if (bio_method == NULL)
            {
                /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
                log_ERR_get_error("failure in BIO_s_mem");
                result = MU_FAILURE;
            }
            else
            {
                /*Codes_SRS_X509_OPENSSL_02_013: [ x509_openssl_add_certificates shall create a new memory BIO by calling BIO_new. ]*/
                BIO* cert_memory_bio = BIO_new(bio_method);
                if (cert_memory_bio == NULL)
                {
                    /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
                    log_ERR_get_error("failure in BIO_new");
                    result = MU_FAILURE;
                }
                else
                {
                    /*Codes_SRS_X509_OPENSSL_02_014: [ x509_openssl_add_certificates shall load certificates into the memory BIO by a call to BIO_puts. ]*/
                    int puts_result = BIO_puts(cert_memory_bio, certificates);
                    if ((puts_result<0) || (puts_result != (int)strlen(certificates)))
                    {
                        /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
                        log_ERR_get_error("failure in BIO_puts");
                        result = MU_FAILURE;
                    }
                    else
                    {
                        X509* certificate;
                        /*Codes_SRS_X509_OPENSSL_02_015: [ x509_openssl_add_certificates shall retrieve each certificate by a call to PEM_read_bio_X509. ]*/
                        while ((certificate = PEM_read_bio_X509(cert_memory_bio, NULL, NULL, NULL)) != NULL)
                        {
                            /*Codes_SRS_X509_OPENSSL_02_016: [ x509_openssl_add_certificates shall add the certificate to the store by a call to X509_STORE_add_cert. ]*/
                            if (!X509_STORE_add_cert(cert_store, certificate))
                            {
                                /*Codes_SRS_X509_OPENSSL_02_017: [ If X509_STORE_add_cert returns with error and that error is X509_R_CERT_ALREADY_IN_HASH_TABLE then x509_openssl_add_certificates shall ignore it as the certificate is already in the store. ]*/
                                /*if the certificate is already in the store, then ERR_peek_error would return REASON == X509_R_CERT_ALREADY_IN_HASH_TABLE, so that's no a "real" error*/
                                unsigned long error = ERR_peek_error();
                                if (ERR_GET_REASON(error) == X509_R_CERT_ALREADY_IN_HASH_TABLE)
                                {
                                    /*not an error*/
                                }
                                else
                                {
                                    /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
                                    log_ERR_get_error("failure in X509_STORE_add_cert");
                                    X509_free(certificate);
                                    break;
                                }

                            }
                            X509_free(certificate);
                        }

                        if (certificate == NULL)
                        {
                            /*Codes_SRS_X509_OPENSSL_02_019: [ Otherwise, x509_openssl_add_certificates shall succeed and return 0. ]*/
                            result = 0;/*all is fine*/
                        }
                        else
                        {
                            /*previous while loop terminated unfortunately*/
                            /*Codes_SRS_X509_OPENSSL_02_018: [ In case of any failure x509_openssl_add_certificates shall fail and return a non-zero value. ]*/
                            result = MU_FAILURE;
                        }
                    }
                    BIO_free(cert_memory_bio);
                }
            }
        }
    }
    return result;
}